

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_futime(uv_loop_t *loop,uv_fs_t *req,uv_file file,double atime,double mtime,uv_fs_cb cb)

{
  uv_fs_cb cb_local;
  double mtime_local;
  double atime_local;
  uv_file file_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    uv__req_init(loop,(uv_req_t *)req,UV_FS);
  }
  req->fs_type = UV_FS_FUTIME;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  req->file = file;
  req->atime = atime;
  req->mtime = mtime;
  if (cb == (uv_fs_cb)0x0) {
    uv__fs_work(&req->work_req);
    loop_local._4_4_ = (int)req->result;
  }
  else {
    uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_futime(uv_loop_t* loop,
                 uv_fs_t* req,
                 uv_file file,
                 double atime,
                 double mtime,
                 uv_fs_cb cb) {
  INIT(FUTIME);
  req->file = file;
  req->atime = atime;
  req->mtime = mtime;
  POST;
}